

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_kernel_bmod.h
# Opt level: O0

void Eigen::internal::LU_kernel_bmod<-1>::
     run<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
               (int segsize,
               Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *dense,
               Matrix<double,__1,_1,_0,__1,_1> *tempv,Matrix<double,__1,_1,_0,__1,_1> *lusup,
               int *luptr,int lda,int nrow,Matrix<int,__1,_1,_0,__1,_1> *lsub,int lptr,int no_zeros)

{
  Scalar SVar1;
  Scalar SVar2;
  double dVar3;
  int iVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  ScalarWithConstIfNotLvalue *pSVar9;
  Index m;
  Index n;
  Index d;
  Index lda_00;
  ScalarWithConstIfNotLvalue *B_00;
  Index ldb;
  ScalarWithConstIfNotLvalue *C;
  Index ldc;
  Scalar *pSVar10;
  long lVar11;
  long lVar12;
  OuterStride<_1> local_160;
  undefined1 local_150 [8];
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_> l;
  int aligned_with_B_offset;
  int aligned_offset;
  undefined1 local_110 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> B;
  int ldl;
  int PacketSize;
  triangular_solve_retval<1,_Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_5U>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_b8;
  Stride<0,_0> local_92;
  undefined1 local_90 [8];
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> u;
  undefined1 local_68 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> A;
  int irow;
  int i;
  int isub;
  int lda_local;
  int *luptr_local;
  Matrix<double,__1,_1,_0,__1,_1> *lusup_local;
  Matrix<double,__1,_1,_0,__1,_1> *tempv_local;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *dense_local;
  int segsize_local;
  
  irow = lptr + no_zeros;
  for (A.m_stride.super_Stride<_1,_0>._12_4_ = 0;
      (int)A.m_stride.super_Stride<_1,_0>._12_4_ < segsize;
      A.m_stride.super_Stride<_1,_0>._12_4_ = A.m_stride.super_Stride<_1,_0>._12_4_ + 1) {
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)lsub,(long)irow);
    A.m_stride.super_Stride<_1,_0>._8_4_ = *pSVar5;
    pSVar6 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)dense,(long)(int)A.m_stride.super_Stride<_1,_0>._8_4_);
    SVar1 = *pSVar6;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)tempv,
                        (long)(int)A.m_stride.super_Stride<_1,_0>._12_4_);
    *pSVar7 = SVar1;
    irow = irow + 1;
  }
  *luptr = lda * no_zeros + no_zeros + *luptr;
  pSVar8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                     (&lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  iVar4 = *luptr;
  OuterStride<-1>::OuterStride((OuterStride<_1> *)&u.field_0x10,(long)lda);
  Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Map
            ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)local_68,
             pSVar8 + iVar4,(long)segsize,(long)segsize,(OuterStride<_1> *)&u.field_0x10);
  pSVar8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                     (&tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  Stride<0,_0>::Stride(&local_92);
  Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_90,pSVar8
             ,(long)segsize,&local_92);
  MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>::
  triangularView<5u>((Type *)&ldl,
                     (MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                      *)local_68);
  TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5u>::
  solve<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            (&local_b8,
             (TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>
              *)&ldl,(MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)local_90);
  MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator=
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
             local_90,(ReturnByValue<Eigen::internal::triangular_solve_retval<1,_Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_5U>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                       *)&local_b8);
  *luptr = segsize + *luptr;
  B.m_stride.super_Stride<_1,_0>._12_4_ = 2;
  B.m_stride.super_Stride<_1,_0>._8_4_ = first_multiple<int>(nrow,2);
  pSVar8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                     (&lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  iVar4 = *luptr;
  OuterStride<-1>::OuterStride((OuterStride<_1> *)&aligned_with_B_offset,(long)lda);
  Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Map
            ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)local_110,
             pSVar8 + iVar4,(long)nrow,(long)segsize,(OuterStride<_1> *)&aligned_with_B_offset);
  pSVar8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                     (&tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  l.m_stride.super_Stride<_1,_0>._12_4_ = first_aligned<double,int>(pSVar8 + segsize,2);
  pSVar9 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
           ::data((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   *)local_110);
  iVar4 = first_aligned<double,int>(pSVar9,2);
  l.m_stride.super_Stride<_1,_0>._8_4_ = (2 - iVar4) % 2;
  pSVar8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                     (&tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  lVar11 = (long)(int)l.m_stride.super_Stride<_1,_0>._12_4_;
  lVar12 = (long)(int)l.m_stride.super_Stride<_1,_0>._8_4_;
  OuterStride<-1>::OuterStride(&local_160,(long)(int)B.m_stride.super_Stride<_1,_0>._8_4_);
  Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>::Map
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_> *)local_150,
             pSVar8 + (long)segsize + lVar11 + lVar12,(long)nrow,&local_160);
  DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>_>::
  setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>_>
           *)local_150);
  m = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>,_0>::
      rows((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_0>
            *)local_150);
  n = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>,_0>::
      cols((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_0>
            *)local_150);
  d = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>::
      cols((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            *)local_110);
  pSVar9 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
           ::data((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   *)local_110);
  lda_00 = Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::outerStride
                     ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                      local_110);
  B_00 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>::
         data((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
               *)local_90);
  ldb = Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::outerStride
                  ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_90)
  ;
  C = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>,_1>::
      data((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_1>
            *)local_150);
  ldc = Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>::outerStride
                  ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_> *)
                   local_150);
  sparselu_gemm<double,long>(m,n,d,pSVar9,lda_00,B_00,ldb,C,ldc);
  irow = lptr + no_zeros;
  for (A.m_stride.super_Stride<_1,_0>._12_4_ = 0;
      (int)A.m_stride.super_Stride<_1,_0>._12_4_ < segsize;
      A.m_stride.super_Stride<_1,_0>._12_4_ = A.m_stride.super_Stride<_1,_0>._12_4_ + 1) {
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)lsub,(long)irow);
    A.m_stride.super_Stride<_1,_0>._8_4_ = *pSVar5;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)tempv,
                        (long)(int)A.m_stride.super_Stride<_1,_0>._12_4_);
    SVar2 = *pSVar7;
    pSVar6 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)dense,(long)(int)A.m_stride.super_Stride<_1,_0>._8_4_);
    *pSVar6 = SVar2;
    irow = irow + 1;
  }
  for (A.m_stride.super_Stride<_1,_0>._12_4_ = 0; (int)A.m_stride.super_Stride<_1,_0>._12_4_ < nrow;
      A.m_stride.super_Stride<_1,_0>._12_4_ = A.m_stride.super_Stride<_1,_0>._12_4_ + 1) {
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)lsub,(long)irow);
    A.m_stride.super_Stride<_1,_0>._8_4_ = *pSVar5;
    pSVar10 = DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::OuterStride<-1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            *)local_150,(long)(int)A.m_stride.super_Stride<_1,_0>._12_4_);
    dVar3 = *pSVar10;
    pSVar6 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)dense,(long)(int)A.m_stride.super_Stride<_1,_0>._8_4_);
    *pSVar6 = *pSVar6 - dVar3;
    irow = irow + 1;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void LU_kernel_bmod<SegSizeAtCompileTime>::run(const int segsize, BlockScalarVector& dense, ScalarVector& tempv, ScalarVector& lusup, Index& luptr, const Index lda,
                                                                  const Index nrow, IndexVector& lsub, const Index lptr, const Index no_zeros)
{
  typedef typename ScalarVector::Scalar Scalar;
  // First, copy U[*,j] segment from dense(*) to tempv(*)
  // The result of triangular solve is in tempv[*]; 
    // The result of matric-vector update is in dense[*]
  Index isub = lptr + no_zeros; 
  int i;
  Index irow;
  for (i = 0; i < ((SegSizeAtCompileTime==Dynamic)?segsize:SegSizeAtCompileTime); i++)
  {
    irow = lsub(isub); 
    tempv(i) = dense(irow); 
    ++isub; 
  }
  // Dense triangular solve -- start effective triangle
  luptr += lda * no_zeros + no_zeros; 
  // Form Eigen matrix and vector 
  Map<Matrix<Scalar,SegSizeAtCompileTime,SegSizeAtCompileTime>, 0, OuterStride<> > A( &(lusup.data()[luptr]), segsize, segsize, OuterStride<>(lda) );
  Map<Matrix<Scalar,SegSizeAtCompileTime,1> > u(tempv.data(), segsize);
  
  u = A.template triangularView<UnitLower>().solve(u); 
  
  // Dense matrix-vector product y <-- B*x 
  luptr += segsize;
  const Index PacketSize = internal::packet_traits<Scalar>::size;
  Index ldl = internal::first_multiple(nrow, PacketSize);
  Map<Matrix<Scalar,Dynamic,SegSizeAtCompileTime>, 0, OuterStride<> > B( &(lusup.data()[luptr]), nrow, segsize, OuterStride<>(lda) );
  Index aligned_offset = internal::first_aligned(tempv.data()+segsize, PacketSize);
  Index aligned_with_B_offset = (PacketSize-internal::first_aligned(B.data(), PacketSize))%PacketSize;
  Map<Matrix<Scalar,Dynamic,1>, 0, OuterStride<> > l(tempv.data()+segsize+aligned_offset+aligned_with_B_offset, nrow, OuterStride<>(ldl) );
  
  l.setZero();
  internal::sparselu_gemm<Scalar>(l.rows(), l.cols(), B.cols(), B.data(), B.outerStride(), u.data(), u.outerStride(), l.data(), l.outerStride());
  
  // Scatter tempv[] into SPA dense[] as a temporary storage 
  isub = lptr + no_zeros;
  for (i = 0; i < ((SegSizeAtCompileTime==Dynamic)?segsize:SegSizeAtCompileTime); i++)
  {
    irow = lsub(isub++); 
    dense(irow) = tempv(i);
  }
  
  // Scatter l into SPA dense[]
  for (i = 0; i < nrow; i++)
  {
    irow = lsub(isub++); 
    dense(irow) -= l(i);
  } 
}